

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ClassSpecifierSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClassSpecifierSyntax,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  ClassSpecifierSyntax *pCVar11;
  
  pCVar11 = (ClassSpecifierSyntax *)allocate(this,0x38,8);
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar2 = args_1->info;
  (pCVar11->super_SyntaxNode).kind = ClassSpecifier;
  (pCVar11->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pCVar11->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pCVar11->colon).kind = TVar3;
  (pCVar11->colon).field_0x2 = uVar4;
  (pCVar11->colon).numFlags = (NumericTokenFlags)NVar5.raw;
  (pCVar11->colon).rawLen = uVar6;
  (pCVar11->colon).info = pIVar1;
  (pCVar11->keyword).kind = TVar7;
  (pCVar11->keyword).field_0x2 = uVar8;
  (pCVar11->keyword).numFlags = (NumericTokenFlags)NVar9.raw;
  (pCVar11->keyword).rawLen = uVar10;
  (pCVar11->keyword).info = pIVar2;
  return pCVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }